

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

StructBuilder * __thiscall
capnp::_::PointerBuilder::getStruct
          (StructBuilder *__return_storage_ptr__,PointerBuilder *this,StructSize size,
          word *defaultValue)

{
  ushort uVar1;
  word *pwVar2;
  AllocateResult AVar3;
  AllocateResult AVar4;
  WirePointer *pWVar5;
  SegmentBuilder *pSVar6;
  SegmentBuilder *pSVar7;
  ushort uVar8;
  undefined8 *puVar9;
  int iVar10;
  WirePointer *pWVar11;
  uint uVar12;
  uint uVar13;
  WirePointer *pWVar14;
  StructSize SVar15;
  ulong uVar16;
  ulong uVar17;
  AllocateResult AVar18;
  WirePointer *local_b8;
  SegmentBuilder *local_b0;
  StructSize local_a4;
  WirePointer *local_a0;
  ulong local_98;
  CapTableBuilder *local_90;
  SegmentBuilder *local_88;
  uint local_80;
  StructSize local_7c;
  WirePointer *local_78;
  ulong local_70;
  ulong local_68;
  StructBuilder *local_60;
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition;
  Fault f;
  
  local_b8 = this->pointer;
  local_b0 = this->segment;
  AVar18.words = local_b8;
  AVar18.segment = local_b0;
  local_90 = this->capTable;
  uVar17 = (ulong)((uint)size >> 0x10);
  local_a4 = size;
  local_98 = uVar17;
  local_60 = __return_storage_ptr__;
  if ((local_b8->field_1).upper32Bits == 0 && (local_b8->offsetAndKind).value == 0)
  goto LAB_00231d32;
  pWVar5 = local_b8 + (long)((int)(local_b8->offsetAndKind).value >> 2) + 1;
  while( true ) {
    pWVar11 = local_b8;
    pSVar6 = local_b0;
    if (((local_b8->offsetAndKind).value & 3) == 2) {
      pSVar6 = BuilderArena::getSegment
                         ((BuilderArena *)(local_b0->super_SegmentReader).arena,
                          (SegmentId)(local_b8->field_1).structRef);
      uVar13 = (pWVar11->offsetAndKind).value;
      pwVar2 = (pSVar6->super_SegmentReader).ptr.ptr;
      uVar17 = (ulong)(uVar13 & 0xfffffff8);
      pWVar14 = (WirePointer *)((long)&pwVar2->content + uVar17);
      pWVar11 = (WirePointer *)((long)&pwVar2[1].content + uVar17);
      if ((uVar13 & 4) == 0) {
        pWVar5 = pWVar11 + ((int)(pWVar14->offsetAndKind).value >> 2);
        uVar17 = local_98;
        pWVar11 = pWVar14;
      }
      else {
        pSVar6 = BuilderArena::getSegment
                           ((BuilderArena *)(pSVar6->super_SegmentReader).arena,
                            (SegmentId)(pWVar14->field_1).structRef);
        pWVar5 = (WirePointer *)
                 ((long)&((pSVar6->super_SegmentReader).ptr.ptr)->content +
                 (ulong)((pWVar14->offsetAndKind).value & 0xfffffff8));
        uVar17 = local_98;
      }
    }
    pWVar14 = local_b8;
    AVar18.words = local_b8;
    AVar18.segment = local_b0;
    if (pSVar6->readOnly == true) {
      SegmentBuilder::throwNotWritable(pSVar6);
    }
    _kjCondition.left = (pWVar11->offsetAndKind).value & OTHER;
    _kjCondition.result = _kjCondition.left == STRUCT;
    _kjCondition.right = STRUCT;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    if (_kjCondition.result) {
      uVar1 = *(ushort *)&pWVar11->field_1;
      uVar16 = (ulong)uVar1;
      uVar8 = *(ushort *)((long)&pWVar11->field_1 + 2);
      pWVar11 = pWVar5 + uVar16;
      SVar15.pointers = 0;
      SVar15.data = uVar1;
      uVar13 = (uint)uVar8;
      if (uVar8 < (ushort)uVar17 || uVar1 < local_a4.data) {
        if (uVar1 <= local_a4.data) {
          SVar15 = local_a4;
        }
        uVar12 = (uint)uVar17;
        if ((ushort)uVar17 < uVar8) {
          uVar12 = uVar13;
        }
        local_a0 = (WirePointer *)CONCAT44(local_a0._4_4_,SVar15);
        local_7c = (StructSize)((uint)SVar15 & 0xffff);
        local_88 = (SegmentBuilder *)CONCAT44(local_88._4_4_,uVar12);
        uVar12 = (uVar12 & 0xffff) + (int)local_7c;
        local_80 = uVar13;
        local_78 = pWVar5;
        local_70 = (ulong)uVar8;
        local_68 = uVar16;
        if ((((local_b8->offsetAndKind).value & 3) == 2) &&
           (pSVar7 = BuilderArena::getSegment
                               ((BuilderArena *)(local_b0->super_SegmentReader).arena,
                                (SegmentId)(local_b8->field_1).structRef), pSVar7->readOnly == false
           )) {
          uVar13 = (pWVar14->offsetAndKind).value;
          puVar9 = (undefined8 *)
                   ((long)&((pSVar7->super_SegmentReader).ptr.ptr)->content +
                   (ulong)(uVar13 & 0xfffffff8));
          if ((uVar13 & 4) == 0) {
            *puVar9 = 0;
          }
          else {
            *puVar9 = 0;
            puVar9[1] = 0;
          }
        }
        (AVar18.words)->offsetAndKind = 0;
        (AVar18.words)->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
        if ((local_b8->field_1).upper32Bits != 0 || (local_b8->offsetAndKind).value != 0) {
          WireHelpers::zeroObject(local_b0,local_90,local_b8);
        }
        uVar17 = local_68;
        AVar18.words = local_b8;
        AVar18.segment = local_b0;
        AVar3.words = (word *)local_b8;
        AVar3.segment = local_b0;
        if (uVar12 == 0) {
          (local_b8->offsetAndKind).value = 0xfffffffc;
          pWVar5 = local_b8;
        }
        else {
          pWVar14 = (WirePointer *)local_b0->pos;
          pWVar5 = (WirePointer *)0x0;
          if ((long)(ulong)uVar12 <=
              (long)((long)(local_b0->super_SegmentReader).ptr.ptr +
                    ((local_b0->super_SegmentReader).ptr.size_ * 8 - (long)pWVar14)) >> 3) {
            local_b0->pos = (word *)(pWVar14 + uVar12);
            pWVar5 = pWVar14;
          }
          if (pWVar5 == (WirePointer *)0x0) {
            AVar18 = BuilderArena::allocate
                               ((BuilderArena *)(local_b0->super_SegmentReader).arena,uVar12 + 1);
            (local_b8->offsetAndKind).value =
                 (int)AVar18.words - *(int *)&((AVar18.segment)->super_SegmentReader).ptr.ptr &
                 0xfffffff8U | 2;
            local_b8->field_1 =
                 (anon_union_4_5_35ddcec3_for_WirePointer_1)
                 ((AVar18.segment)->super_SegmentReader).id.value;
            *(undefined4 *)&(AVar18.words)->content = 0;
            pWVar5 = (WirePointer *)(AVar18.words + 1);
          }
          else {
            (local_b8->offsetAndKind).value =
                 ((uint)((ulong)((long)pWVar5 - (long)local_b8) >> 1) & 0xfffffffc) - 4;
            AVar18 = AVar3;
          }
        }
        uVar13 = local_80;
        local_b8 = (WirePointer *)AVar18.words;
        local_b0 = AVar18.segment;
        (local_b8->field_1).structRef.dataSize.value = (unsigned_short)local_a0;
        (local_b8->field_1).structRef.ptrCount.value = (unsigned_short)local_88;
        if ((int)uVar17 != 0) {
          memcpy(pWVar5,local_78,(ulong)(uint)((int)uVar17 << 3));
          AVar18.words = local_b8;
          AVar18.segment = local_b0;
        }
        pWVar14 = pWVar5 + ((ulong)local_a0 & 0xffff);
        uVar17 = local_70;
        local_a0 = pWVar14;
        if ((short)uVar13 != 0) {
          do {
            local_b8 = (WirePointer *)AVar18.words;
            local_b0 = AVar18.segment;
            WireHelpers::transferPointer(local_b0,pWVar14,pSVar6,pWVar11);
            AVar18.words = local_b8;
            AVar18.segment = local_b0;
            pWVar14 = pWVar14 + 1;
            pWVar11 = pWVar11 + 1;
            uVar17 = uVar17 - 1;
          } while (uVar17 != 0);
        }
        local_b8 = (WirePointer *)AVar18.words;
        local_b0 = AVar18.segment;
        iVar10 = (int)local_70 + (int)local_68;
        if (iVar10 != 0) {
          memset(local_78,0,(ulong)(uint)(iVar10 * 8));
          AVar18.words = local_b8;
          AVar18.segment = local_b0;
        }
        local_b0 = AVar18.segment;
        uVar8 = (ushort)local_88;
        uVar17 = local_98;
        pWVar11 = local_a0;
        pSVar6 = local_b0;
        __return_storage_ptr__ = local_60;
        SVar15 = local_7c;
      }
      __return_storage_ptr__->segment = pSVar6;
      __return_storage_ptr__->capTable = local_90;
      __return_storage_ptr__->data = pWVar5;
      __return_storage_ptr__->pointers = pWVar11;
      __return_storage_ptr__->dataSize = (int)SVar15 << 6;
      __return_storage_ptr__->pointerCount = uVar8;
      iVar10 = 1;
    }
    else {
      local_88 = pSVar6;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[88]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x47b,FAILED,"oldRef->kind() == WirePointer::STRUCT",
                 "_kjCondition,\"Schema mismatch: Message contains non-struct pointer where struct pointer was expected.\""
                 ,&_kjCondition,
                 (char (*) [88])
                 "Schema mismatch: Message contains non-struct pointer where struct pointer was expected."
                );
      uVar17 = local_98;
      kj::_::Debug::Fault::~Fault(&f);
      AVar18.words = local_b8;
      AVar18.segment = local_b0;
      iVar10 = 2;
    }
    if (iVar10 != 2) break;
LAB_00231d32:
    local_b8 = (WirePointer *)AVar18.words;
    pWVar5 = local_b8;
    local_b0 = AVar18.segment;
    pSVar6 = local_b0;
    if (((WirePointer *)defaultValue == (WirePointer *)0x0) ||
       ((((WirePointer *)defaultValue)->field_1).upper32Bits == 0 &&
        (((WirePointer *)defaultValue)->offsetAndKind).value == 0)) {
      uVar12 = (uint)local_a4 & 0xffff;
      uVar13 = (int)uVar17 + uVar12;
      AVar4 = AVar18;
      if ((local_b8->field_1).upper32Bits != 0 || (local_b8->offsetAndKind).value != 0) {
        WireHelpers::zeroObject(local_b0,local_90,local_b8);
        AVar4.words = (word *)local_b8;
        AVar4.segment = local_b0;
      }
      local_b8 = (WirePointer *)AVar4.words;
      local_b0 = AVar4.segment;
      if (uVar13 == 0) {
        (pWVar5->offsetAndKind).value = 0xfffffffc;
      }
      else {
        pWVar11 = (WirePointer *)pSVar6->pos;
        if ((long)((long)(pSVar6->super_SegmentReader).ptr.ptr +
                  ((pSVar6->super_SegmentReader).ptr.size_ * 8 - (long)pWVar11)) >> 3 <
            (long)(ulong)uVar13) {
          pWVar11 = (WirePointer *)0x0;
        }
        else {
          pSVar6->pos = (word *)(pWVar11 + uVar13);
        }
        if (pWVar11 == (WirePointer *)0x0) {
          AVar18 = BuilderArena::allocate
                             ((BuilderArena *)(pSVar6->super_SegmentReader).arena,uVar13 + 1);
          (pWVar5->offsetAndKind).value =
               (int)AVar18.words - *(int *)&((AVar18.segment)->super_SegmentReader).ptr.ptr &
               0xfffffff8U | 2;
          pWVar5->field_1 =
               (anon_union_4_5_35ddcec3_for_WirePointer_1)
               ((AVar18.segment)->super_SegmentReader).id.value;
          *(undefined4 *)&(AVar18.words)->content = 0;
          pWVar5 = (WirePointer *)(AVar18.words + 1);
        }
        else {
          (pWVar5->offsetAndKind).value =
               ((uint)((ulong)((long)pWVar11 - (long)pWVar5) >> 1) & 0xfffffffc) - 4;
          pWVar5 = pWVar11;
        }
      }
      *(StructSize *)((long)&(AVar18.words)->content + 4) = local_a4;
      __return_storage_ptr__->segment = AVar18.segment;
      __return_storage_ptr__->capTable = local_90;
      __return_storage_ptr__->data = pWVar5;
      __return_storage_ptr__->pointers = pWVar5 + ((uint)local_a4 & 0xffff);
      __return_storage_ptr__->dataSize = uVar12 << 6;
      __return_storage_ptr__->pointerCount = (StructPointerCount)local_98;
      return __return_storage_ptr__;
    }
    pWVar5 = (WirePointer *)
             WireHelpers::copyMessage(&local_b0,local_90,&local_b8,(WirePointer *)defaultValue);
    defaultValue = (word *)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

StructBuilder PointerBuilder::getStruct(StructSize size, const word* defaultValue) {
  return WireHelpers::getWritableStructPointer(pointer, segment, capTable, size, defaultValue);
}